

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O0

void __thiscall
leveldb::Iterator::RegisterCleanup(Iterator *this,CleanupFunction func,void *arg1,void *arg2)

{
  long lVar1;
  bool bVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  CleanupNode *node;
  CleanupNode *in_stack_ffffffffffffffb8;
  long *local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == 0) {
    __assert_fail("func != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/iterator.cc"
                  ,0x1b,"void leveldb::Iterator::RegisterCleanup(CleanupFunction, void *, void *)");
  }
  bVar2 = CleanupNode::IsEmpty(in_stack_ffffffffffffffb8);
  if (bVar2) {
    local_30 = (long *)(in_RDI + 8);
  }
  else {
    local_30 = (long *)operator_new(0x20);
    memset(local_30,0,0x20);
    local_30[3] = *(long *)(in_RDI + 0x20);
    *(long **)(in_RDI + 0x20) = local_30;
  }
  *local_30 = in_RSI;
  local_30[1] = in_RDX;
  local_30[2] = in_RCX;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Iterator::RegisterCleanup(CleanupFunction func, void* arg1, void* arg2) {
  assert(func != nullptr);
  CleanupNode* node;
  if (cleanup_head_.IsEmpty()) {
    node = &cleanup_head_;
  } else {
    node = new CleanupNode();
    node->next = cleanup_head_.next;
    cleanup_head_.next = node;
  }
  node->function = func;
  node->arg1 = arg1;
  node->arg2 = arg2;
}